

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# best_constant.h
# Opt level: O2

void count_label(shared_data *sd,float l)

{
  float fVar1;
  
  if (((l != 3.4028235e+38) || (NAN(l))) && (sd->is_more_than_two_labels_observed == false)) {
    fVar1 = sd->first_observed_label;
    if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
      if ((fVar1 != l) || (NAN(fVar1) || NAN(l))) {
        fVar1 = sd->second_observed_label;
        if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
          sd->second_observed_label = l;
          return;
        }
        if ((fVar1 != l) || (NAN(fVar1) || NAN(l))) {
          sd->is_more_than_two_labels_observed = true;
          return;
        }
      }
    }
    else {
      sd->first_observed_label = l;
    }
  }
  return;
}

Assistant:

inline void count_label(shared_data* sd, float l)
{
  if (sd->is_more_than_two_labels_observed || l == FLT_MAX)
    return;

  if (sd->first_observed_label != FLT_MAX)
  {
    if (sd->first_observed_label != l)
    {
      if (sd->second_observed_label != FLT_MAX)
      {
        if (sd->second_observed_label != l)
          sd->is_more_than_two_labels_observed = true;
      }
      else
        sd->second_observed_label = l;
    }
  }
  else
    sd->first_observed_label = l;
}